

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O0

void __thiscall cookmem::PtrAVLTree::add(PtrAVLTree *this,void *ptr,size_t size)

{
  Node *pNVar1;
  Node *apNStack_40240 [32768];
  Node *next;
  Node *pNStack_238;
  int16_t depth;
  Node *stack [65];
  Node *root;
  Node *node;
  size_t size_local;
  void *ptr_local;
  PtrAVLTree *this_local;
  
  *(size_t *)((long)ptr + 8) = size;
  if (this->m_root == (Node *)0x0) {
    *(undefined8 *)((long)ptr + 0x10) = 0;
    *(undefined8 *)((long)ptr + 0x18) = 0;
    *(undefined8 *)((long)ptr + 0x20) = 0;
    *(undefined2 *)((long)ptr + 0x28) = 1;
    this->m_root = (Node *)ptr;
  }
  else {
    pNStack_238 = this->m_root;
    stack[0x40] = this->m_root;
    next._6_2_ = 0;
    while (stack[0x40] != (Node *)0x0) {
      if (size < stack[0x40]->size) {
        pNVar1 = stack[0x40]->left;
        stack[(long)(next._6_2_ + 1) + -1] = pNVar1;
        stack[0x40] = pNVar1;
      }
      else {
        if (size <= stack[0x40]->size) {
          pNVar1 = stack[0x40]->next;
          stack[0x40]->next = (Node *)ptr;
          *(Node **)((long)ptr + 0x20) = pNVar1;
          *(Node **)((long)ptr + 0x10) = stack[0x40];
          *(undefined2 *)((long)ptr + 0x28) = 0xffff;
          if (pNVar1 == (Node *)0x0) {
            return;
          }
          pNVar1->left = (Node *)ptr;
          return;
        }
        pNVar1 = stack[0x40]->right;
        stack[(long)(next._6_2_ + 1) + -1] = pNVar1;
        stack[0x40] = pNVar1;
      }
      next._6_2_ = next._6_2_ + 1;
    }
    setParent((Node *)ptr,stack[(long)(next._6_2_ + -1) + -1]);
    *(undefined8 *)((long)ptr + 0x10) = 0;
    *(undefined8 *)((long)ptr + 0x18) = 0;
    *(undefined8 *)((long)ptr + 0x20) = 0;
    *(undefined2 *)((long)ptr + 0x28) = 1;
    pNVar1 = balance(&stack0xfffffffffffffdc8,next._6_2_);
    if (pNVar1 != (Node *)0x0) {
      this->m_root = pNVar1;
    }
  }
  return;
}

Assistant:

void
    add (void* ptr, std::size_t size)
    {
        Node*   node = reinterpret_cast<Node*>(ptr);
        node->size = size;

        if (m_root == nullptr)
        {
            node->left = nullptr;
            node->right = nullptr;
            node->next = nullptr;
            node->height = 1;
            m_root = node;

            return;
        }

        Node* root;
        Node* stack[sizeof(Node*) * 8 + 1];
        std::int16_t depth;

        root = stack[0] = m_root;

        for (depth = 0; ; ++depth)
        {
            if (root == nullptr)
            {
                setParent (node, stack[depth - 1]);
                node->left = nullptr;
                node->right = nullptr;
                node->next = nullptr;
                node->height = 1;

                root = balance (stack, depth);
                if (root != nullptr)
                {
                    m_root = root;
                }
                return;
            }

            if (size < root->size)
            {
                root = stack[depth + 1] = root->left;
                continue;
            }
            else if (size > root->size)
            {
                root = stack[depth + 1] = root->right;
                continue;
            }
            else
            {
                // The current root matches the node's size.  In this case we
                // just add node to the next pointer of the root.
                //
                Node* next = root->next;
                root->next = node;
                node->next = next;
                node->left = root;
                node->height = -1;      // indicating that this node is in a DLL
                if (next)
                {
                    next->left = node;
                }

                // We can simply return since the tree structure is not
                // changed.
                return;
            }
        }
        throw Exception (MEM_ERROR_GENERAL, "Invalid PtrAVLTree.");
    }